

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_String * cff_index_get_name(CFF_Font_conflict font,FT_UInt element)

{
  FT_String *local_48;
  FT_String *name;
  size_t sStack_38;
  FT_Error error;
  FT_ULong byte_len;
  FT_Byte *bytes;
  FT_Memory memory;
  CFF_Index idx;
  CFF_Font_conflict pCStack_10;
  FT_UInt element_local;
  CFF_Font_conflict font_local;
  
  memory = (FT_Memory)&font->name_index;
  local_48 = (FT_String *)0x0;
  if (((CFF_IndexRec *)memory)->stream != (FT_Stream)0x0) {
    bytes = (FT_Byte *)((CFF_IndexRec *)memory)->stream->memory;
    idx._4_4_ = element;
    pCStack_10 = font;
    name._4_4_ = cff_index_access_element
                           ((CFF_Index)memory,element,(FT_Byte **)&byte_len,&stack0xffffffffffffffc8
                           );
    if (name._4_4_ == 0) {
      local_48 = (FT_String *)
                 ft_mem_qalloc((FT_Memory)bytes,sStack_38 + 1,(FT_Error *)((long)&name + 4));
      if (name._4_4_ == 0) {
        memcpy(local_48,(void *)byte_len,sStack_38);
        local_48[sStack_38] = '\0';
      }
      cff_index_forget_element((CFF_Index)memory,(FT_Byte **)&byte_len);
    }
  }
  return local_48;
}

Assistant:

FT_LOCAL_DEF( FT_String* )
  cff_index_get_name( CFF_Font  font,
                      FT_UInt   element )
  {
    CFF_Index   idx = &font->name_index;
    FT_Memory   memory;
    FT_Byte*    bytes;
    FT_ULong    byte_len;
    FT_Error    error;
    FT_String*  name = NULL;


    if ( !idx->stream )  /* CFF2 does not include a name index */
      goto Exit;

    memory = idx->stream->memory;

    error = cff_index_access_element( idx, element, &bytes, &byte_len );
    if ( error )
      goto Exit;

    if ( !FT_QALLOC( name, byte_len + 1 ) )
    {
      FT_MEM_COPY( name, bytes, byte_len );
      name[byte_len] = 0;
    }
    cff_index_forget_element( idx, &bytes );

  Exit:
    return name;
  }